

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void nn(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *args)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  istream *piVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string queryWord;
  string prompt;
  FastText fasttext;
  int32_t k;
  string *in_stack_00000158;
  FastText *in_stack_00000160;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  string *in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffeee;
  undefined1 in_stack_fffffffffffffeef;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffef0;
  FastText *in_stack_ffffffffffffff00;
  allocator local_d9;
  string local_d8 [48];
  string local_a8 [132];
  int32_t in_stack_ffffffffffffffdc;
  string *in_stack_ffffffffffffffe0;
  FastText *in_stack_ffffffffffffffe8;
  
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  if (sVar2 != 3) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI);
    if (sVar2 != 4) {
      printNNUsage();
      exit(1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,3);
    std::__cxx11::stoi(in_stack_fffffffffffffed0,
                       (size_t *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),0);
  }
  ::fasttext::FastText::FastText(in_stack_ffffffffffffff00);
  pvVar3 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RDI,2);
  std::__cxx11::string::string(local_a8,(string *)pvVar3);
  ::fasttext::FastText::loadModel(in_stack_00000160,in_stack_00000158);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Query word? ",&local_d9);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::operator<<((ostream *)&std::cout,local_d8);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff00);
  while( true ) {
    piVar4 = std::operator>>((istream *)&std::cin,(string *)&stack0xffffffffffffff00);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar1) break;
    ::fasttext::FastText::getNN
              (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
    printPredictions(in_stack_fffffffffffffef0,(bool)in_stack_fffffffffffffeef,
                     (bool)in_stack_fffffffffffffeee);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_RDI);
    std::operator<<((ostream *)&std::cout,local_d8);
  }
  exit(0);
}

Assistant:

void nn(const std::vector<std::string> args) {
  int32_t k;
  if (args.size() == 3) {
    k = 10;
  } else if (args.size() == 4) {
    k = std::stoi(args[3]);
  } else {
    printNNUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));
  std::string prompt("Query word? ");
  std::cout << prompt;

  std::string queryWord;
  while (std::cin >> queryWord) {
    printPredictions(fasttext.getNN(queryWord, k), true, true);
    std::cout << prompt;
  }
  exit(0);
}